

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlimits.c
# Opt level: O0

int runcrazy(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  uint local_20;
  uint i;
  int old_leaks;
  int old_tests;
  int old_errors;
  int res;
  int ret;
  
  iVar3 = nb_tests;
  iVar2 = nb_leaks;
  iVar1 = nb_errors;
  old_errors = 0;
  old_tests = 0;
  if (tests_quiet == 0) {
    printf("## Crazy tests on reader\n");
  }
  for (local_20 = 0; sVar5 = strlen(crazy), local_20 < sVar5; local_20 = local_20 + 1) {
    iVar4 = get_crazy_fail(local_20);
    iVar4 = launchCrazy(local_20,iVar4);
    old_tests = iVar4 + old_tests;
    if (old_tests != 0) {
      old_errors = old_errors + 1;
    }
  }
  if (tests_quiet == 0) {
    printf("\n## Crazy tests on SAX\n");
  }
  for (local_20 = 0; sVar5 = strlen(crazy), local_20 < sVar5; local_20 = local_20 + 1) {
    iVar4 = get_crazy_fail(local_20);
    iVar4 = launchCrazySAX(local_20,iVar4);
    old_tests = iVar4 + old_tests;
    if (old_tests != 0) {
      old_errors = old_errors + 1;
    }
  }
  if (tests_quiet == 0) {
    fprintf(_stderr,"\n");
  }
  if (verbose != 0) {
    if ((nb_errors == iVar1) && (nb_leaks == iVar2)) {
      printf("Ran %d tests, no errors\n",(ulong)(uint)(nb_tests - iVar3));
    }
    else {
      printf("Ran %d tests, %d errors, %d leaks\n",(ulong)(uint)(nb_tests - iVar3),
             (ulong)(uint)(nb_errors - iVar1),(ulong)(uint)(nb_leaks - iVar2));
    }
  }
  return old_errors;
}

Assistant:

static int
runcrazy(void) {
    int ret = 0, res = 0;
    int old_errors, old_tests, old_leaks;
    unsigned int i;

    old_errors = nb_errors;
    old_tests = nb_tests;
    old_leaks = nb_leaks;

#ifdef LIBXML_READER_ENABLED
    if (tests_quiet == 0) {
	printf("## Crazy tests on reader\n");
    }
    for (i = 0;i < strlen(crazy);i++) {
        res += launchCrazy(i, get_crazy_fail(i));
        if (res != 0)
            ret++;
    }
#endif

    if (tests_quiet == 0) {
	printf("\n## Crazy tests on SAX\n");
    }
    for (i = 0;i < strlen(crazy);i++) {
        res += launchCrazySAX(i, get_crazy_fail(i));
        if (res != 0)
            ret++;
    }
    if (tests_quiet == 0)
        fprintf(stderr, "\n");
    if (verbose) {
	if ((nb_errors == old_errors) && (nb_leaks == old_leaks))
	    printf("Ran %d tests, no errors\n", nb_tests - old_tests);
	else
	    printf("Ran %d tests, %d errors, %d leaks\n",
		   nb_tests - old_tests,
		   nb_errors - old_errors,
		   nb_leaks - old_leaks);
    }
    return(ret);
}